

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.hpp
# Opt level: O0

void __thiscall KmerCounter::KmerCounter(KmerCounter *this,WorkSpace *_ws,string *filename)

{
  string *in_RDX;
  WorkSpace *in_RSI;
  KmerCounter *in_RDI;
  ifstream count_file;
  ifstream *in_stack_fffffffffffffd88;
  KmerCounter *this_00;
  undefined1 local_220 [520];
  string *local_18;
  WorkSpace *local_10;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x44ee39);
  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::vector
            ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)0x44ee4c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x44ee5f);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            *)0x44ee72);
  std::__cxx11::string::string((string *)&in_RDI->name);
  in_RDI->ws = local_10;
  in_RDI->kci_peak_f = -1.0;
  std::
  unordered_map<long,_float,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_float>_>_>
  ::unordered_map((unordered_map<long,_float,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_float>_>_>
                   *)0x44eeb4);
  std::
  unordered_map<unsigned___int128,_float,_std::hash<unsigned___int128>,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_float>_>_>
  ::unordered_map((unordered_map<unsigned___int128,_float,_std::hash<unsigned___int128>,_std::equal_to<unsigned___int128>,_std::allocator<std::pair<const_unsigned___int128,_float>_>_>
                   *)0x44eeca);
  std::ifstream::ifstream(local_220,local_18,_S_in);
  read_counts(this_00,in_stack_fffffffffffffd88);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

KmerCounter (const WorkSpace &_ws, const std::string &filename):ws(_ws) {
        std::ifstream count_file(filename);
        read_counts(count_file);
    }